

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O2

void __thiscall CaDiCaL::Queue::enqueue(Queue *this,Links *links,int idx)

{
  int iVar1;
  pointer pLVar2;
  
  pLVar2 = (links->super__Vector_base<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->last;
  pLVar2[idx].prev = iVar1;
  if ((long)iVar1 == 0) {
    this->first = idx;
  }
  else {
    pLVar2[iVar1].next = idx;
  }
  this->last = idx;
  pLVar2[idx].next = 0;
  return;
}

Assistant:

inline void enqueue (Links &links, int idx) {
    Link &l = links[idx];
    if ((l.prev = last))
      links[last].next = idx;
    else
      first = idx;
    last = idx;
    l.next = 0;
  }